

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lock.c
# Opt level: O0

int main(int argc,char **argv)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  MPI_Comm name;
  void *__ptr;
  void *__ptr_00;
  undefined8 in_RSI;
  undefined4 in_EDI;
  MPI_Comm comm;
  int ld [1];
  int hi [1];
  int lo [1];
  int num_mutex;
  size_t i;
  double *p2;
  double *p1;
  size_t num;
  int pg_world;
  int chunk [1];
  int dims [1];
  int g_a;
  int status;
  int nproc;
  int me;
  int *in_stack_00000070;
  void *in_stack_00000078;
  int *in_stack_00000080;
  int *in_stack_00000088;
  int in_stack_00000094;
  int p_handle;
  int in_stack_ffffffffffffffa4;
  ulong local_50;
  undefined1 local_10 [4];
  undefined4 uVar4;
  
  iVar2 = (int)((ulong)in_RSI >> 0x20);
  uVar4 = 0;
  p_handle = 1;
  MPI_Init(&stack0xfffffffffffffff8,local_10);
  GA_Initialize();
  uVar1 = GA_Nodeid();
  GA_Nnodes();
  name = GA_MPI_Comm_pgroup_default();
  printf("%d: Hello world!\n",(ulong)uVar1);
  if (uVar1 == 0) {
    printf("%d: GA_Initialize\n",0);
    printf("%d: GA_Create_handle\n",0);
  }
  GA_Create_handle();
  if (uVar1 == 0) {
    printf("%d: GA_Set_array_name\n",0);
  }
  GA_Set_array_name(in_stack_ffffffffffffffa4,(char *)name);
  if (uVar1 == 0) {
    printf("%d: GA_Set_data\n",0);
  }
  GA_Set_data(comm._4_4_,(int)comm,(int *)CONCAT44(uVar4,in_EDI),iVar2);
  if (uVar1 == 0) {
    printf("%d: GA_Set_chunk\n",0);
  }
  GA_Set_chunk(comm._4_4_,(int *)CONCAT44(uVar4,in_EDI));
  if (uVar1 == 0) {
    printf("%d: GA_Pgroup_get_world\n",0);
  }
  GA_Pgroup_get_world();
  if (uVar1 == 0) {
    printf("%d: GA_Set_pgroup\n",0);
  }
  GA_Set_pgroup(in_stack_ffffffffffffffa4,p_handle);
  if (uVar1 == 0) {
    printf("%d: GA_Allocate\n",0);
  }
  iVar2 = GA_Allocate(in_stack_ffffffffffffffa4);
  if (iVar2 == 0) {
    MPI_Abort(name,100);
  }
  if (uVar1 == 0) {
    printf("%d: GA_Zero\n",0);
  }
  GA_Zero(in_stack_ffffffffffffffa4);
  if (uVar1 == 0) {
    printf("%d: GA_Sync\n",0);
  }
  GA_Sync();
  __ptr = malloc(0x50);
  if (__ptr == (void *)0x0) {
    MPI_Abort(name,1000);
  }
  __ptr_00 = malloc(0x50);
  if (__ptr_00 == (void *)0x0) {
    MPI_Abort(name,2000);
  }
  for (local_50 = 0; local_50 < 10; local_50 = local_50 + 1) {
    *(undefined8 *)((long)__ptr + local_50 * 8) = 0x401c000000000000;
  }
  for (local_50 = 0; local_50 < 10; local_50 = local_50 + 1) {
    *(undefined8 *)((long)__ptr_00 + local_50 * 8) = 0x4008000000000000;
  }
  uVar3 = GA_Create_mutexes(p_handle);
  if (uVar1 == 0) {
    printf("%d: GA_Create_mutexes = %d\n",0,(ulong)uVar3);
    printf("%d: before GA_Lock\n",0);
    GA_Lock(in_stack_ffffffffffffffa4);
    in_stack_ffffffffffffffa4 = 9;
    GA_Init_fence();
    NGA_Put(in_stack_00000094,in_stack_00000088,in_stack_00000080,in_stack_00000078,
            in_stack_00000070);
    GA_Fence();
    GA_Unlock(in_stack_ffffffffffffffa4);
    printf("%d: after GA_Unlock\n",0);
  }
  GA_Print(in_stack_ffffffffffffffa4);
  if (uVar1 == 1) {
    printf("%d: before GA_Lock\n",1);
    GA_Lock(in_stack_ffffffffffffffa4);
    in_stack_ffffffffffffffa4 = 9;
    GA_Init_fence();
    NGA_Get(in_stack_00000094,in_stack_00000088,in_stack_00000080,in_stack_00000078,
            in_stack_00000070);
    GA_Fence();
    GA_Unlock(in_stack_ffffffffffffffa4);
    printf("%d: after GA_Unlock\n",1);
    for (local_50 = 0; local_50 < 10; local_50 = local_50 + 1) {
      printf("p2[%2lu] = %20.10f\n",*(undefined8 *)((long)__ptr_00 + local_50 * 8),local_50);
    }
  }
  uVar3 = GA_Destroy_mutexes();
  if (uVar1 == 0) {
    printf("%d: GA_Destroy_mutexes = %d\n",0,(ulong)uVar3);
  }
  free(__ptr_00);
  free(__ptr);
  if (uVar1 == 0) {
    printf("%d: GA_Destroy\n",0);
  }
  GA_Destroy(in_stack_ffffffffffffffa4);
  if (uVar1 == 0) {
    printf("%d: GA_Terminate\n",0);
  }
  GA_Terminate();
  if (uVar1 == 0) {
    printf("%d: MPI_Finalize\n",0);
  }
  MPI_Finalize();
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
    int me;
    int nproc;
    int status;
    int g_a;
    int dims[NDIM];
    int chunk[NDIM];
    int pg_world;
    size_t num = 10;
    double *p1 = NULL;
    double *p2 = NULL;
    size_t i;
    int num_mutex;
    int lo[1];
    int hi[1];
    int ld[1]={1};
    MPI_Comm comm;

    MP_INIT(argc,argv);
    GA_INIT(argc,argv);

    me = GA_Nodeid();
    nproc = GA_Nnodes();
    comm = GA_MPI_Comm_pgroup_default();

    printf("%d: Hello world!\n",me);

    if (me==0) printf("%d: GA_Initialize\n",me);
    /*if (me==0) printf("%d: ARMCI_Init\n",me);*/
    /*ARMCI_Init();*/
    /*if (me==0) printf("%d: MA_Init\n",me);*/
    /*MA_init(MT_DBL, 8*1024*1024, 2*1024*1024);*/

    if (me==0) printf("%d: GA_Create_handle\n",me);
    g_a = GA_Create_handle();

    if (me==0) printf("%d: GA_Set_array_name\n",me);
    GA_Set_array_name(g_a,"test array A");

    dims[0] = 30;
    if (me==0) printf("%d: GA_Set_data\n",me);
    GA_Set_data(g_a,NDIM,dims,MT_DBL);

    chunk[0] = -1;
    if (me==0) printf("%d: GA_Set_chunk\n",me);
    GA_Set_chunk(g_a,chunk);

    if (me==0) printf("%d: GA_Pgroup_get_world\n",me);
    pg_world = GA_Pgroup_get_world();
    if (me==0) printf("%d: GA_Set_pgroup\n",me);
    GA_Set_pgroup(g_a,pg_world);

    if (me==0) printf("%d: GA_Allocate\n",me);
    status = GA_Allocate(g_a);
    if(0 == status) MPI_Abort(comm,100);

    if (me==0) printf("%d: GA_Zero\n",me);
    GA_Zero(g_a);

    if (me==0) printf("%d: GA_Sync\n",me);
    GA_Sync();

    num = 10;
    p1 = malloc(num*sizeof(double));
    /*double* p1 = ARMCI_Malloc_local(num*sizeof(double));*/
    if (p1==NULL) MPI_Abort(comm,1000);
    p2 = malloc(num*sizeof(double));
    /*double* p2 = ARMCI_Malloc_local(num*sizeof(double));*/
    if (p2==NULL) MPI_Abort(comm,2000);

    for ( i=0 ; i<num ; i++ ) p1[i] = 7.0;
    for ( i=0 ; i<num ; i++ ) p2[i] = 3.0;

    num_mutex = 17;
    status = GA_Create_mutexes(num_mutex);
    if (me==0) printf("%d: GA_Create_mutexes = %d\n",me,status);

/***************************************************************/
    if (me==0) {
        printf("%d: before GA_Lock\n",me);
        GA_Lock(0);
        lo[0] = 0;
        hi[0] = num-1;
        GA_Init_fence();
        NGA_Put(g_a,lo,hi,p1,ld);
        GA_Fence();
        GA_Unlock(0);
        printf("%d: after GA_Unlock\n",me);
    } 
    GA_Print(g_a);
    if (me==1) {
        printf("%d: before GA_Lock\n",me);
        GA_Lock(0);
        lo[0] = 0;
        hi[0] = num-1;
        GA_Init_fence();
        NGA_Get(g_a,lo,hi,p2,ld);
        GA_Fence();
        GA_Unlock(0);
        printf("%d: after GA_Unlock\n",me);
        for ( i=0 ; i<num ; i++ ) printf("p2[%2lu] = %20.10f\n",
                (long unsigned)i,p2[i]);
    }
/***************************************************************/



    status = GA_Destroy_mutexes();
    if (me==0) printf("%d: GA_Destroy_mutexes = %d\n",me,status);

    /*ARMCI_Free(p2);*/
    /*ARMCI_Free(p1);*/
    free(p2);
    free(p1);

    if (me==0) printf("%d: GA_Destroy\n",me);
    GA_Destroy(g_a);

    /*if (me==0) printf("%d: ARMCI_Finalize\n",me);*/
    /*ARMCI_Finalize();*/
    if (me==0) printf("%d: GA_Terminate\n",me);
    GA_Terminate();
    if (me==0) printf("%d: MPI_Finalize\n",me);
    MPI_Finalize();

    return(0);
}